

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float64_suite::fail_array64_float64_missing_length_three(void)

{
  value_type input [6];
  decoder decoder;
  undefined4 local_40;
  value local_3c;
  uchar local_38 [8];
  decoder local_30;
  
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[0] = 0xdf;
  local_38[1] = '\b';
  local_38[2] = '\0';
  local_38[3] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[6]>
            (&local_30,(uchar (*) [6])local_38);
  local_3c = local_30.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x10e2,"void compact_float64_suite::fail_array64_float64_missing_length_three()",
             &local_3c,&local_40);
  return;
}

Assistant:

void fail_array64_float64_missing_length_three()
{
    const value_type input[] = { token::code::array64_float64, 0x08, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}